

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O1

void Gia_ManStaticFanoutStop(Gia_Man_t *p)

{
  int *piVar1;
  
  if (p->vFanoutNums != (Vec_Int_t *)0x0) {
    piVar1 = p->vFanoutNums->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vFanoutNums->pArray = (int *)0x0;
    }
    if (p->vFanoutNums != (Vec_Int_t *)0x0) {
      free(p->vFanoutNums);
      p->vFanoutNums = (Vec_Int_t *)0x0;
    }
  }
  if (p->vFanout != (Vec_Int_t *)0x0) {
    piVar1 = p->vFanout->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vFanout->pArray = (int *)0x0;
    }
    if (p->vFanout != (Vec_Int_t *)0x0) {
      free(p->vFanout);
      p->vFanout = (Vec_Int_t *)0x0;
    }
  }
  return;
}

Assistant:

void Gia_ManStaticFanoutStop( Gia_Man_t * p )
{
    Vec_IntFreeP( &p->vFanoutNums );
    Vec_IntFreeP( &p->vFanout );
}